

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::CaseGenerateSyntax::CaseGenerateSyntax
          (CaseGenerateSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          Token keyword,Token openParen,ExpressionSyntax *condition,Token closeParen,
          SyntaxList<slang::syntax::CaseItemSyntax> *items,Token endCase)

{
  Token TVar1;
  Token TVar2;
  ExpressionSyntax *pEVar3;
  iterator ppCVar4;
  CaseItemSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::CaseItemSyntax> *__range2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_38;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  CaseGenerateSyntax *this_local;
  Token openParen_local;
  Token keyword_local;
  
  TVar2 = endCase;
  TVar1 = closeParen;
  openParen_local._0_8_ = openParen.info;
  this_local = openParen._0_8_;
  openParen_local.info = keyword._0_8_;
  local_38 = attributes;
  attributes_local = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,CaseGenerate,attributes);
  *(Info **)&this->keyword = openParen_local.info;
  (this->keyword).info = keyword.info;
  *(CaseGenerateSyntax **)&this->openParen = this_local;
  (this->openParen).info = (Info *)openParen_local._0_8_;
  __range2 = (SyntaxList<slang::syntax::CaseItemSyntax> *)condition;
  not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
            ((not_null<slang::syntax::ExpressionSyntax*> *)&this->condition,
             (ExpressionSyntax **)&__range2);
  (this->closeParen).kind = closeParen.kind;
  (this->closeParen).field_0x2 = closeParen._2_1_;
  (this->closeParen).numFlags = (NumericTokenFlags)closeParen.numFlags.raw;
  (this->closeParen).rawLen = closeParen.rawLen;
  closeParen.info = TVar1.info;
  (this->closeParen).info = closeParen.info;
  SyntaxList<slang::syntax::CaseItemSyntax>::SyntaxList(&this->items,items);
  (this->endCase).kind = endCase.kind;
  (this->endCase).field_0x2 = endCase._2_1_;
  (this->endCase).numFlags = (NumericTokenFlags)endCase.numFlags.raw;
  (this->endCase).rawLen = endCase.rawLen;
  endCase.info = TVar2.info;
  (this->endCase).info = endCase.info;
  pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::operator->(&this->condition);
  (pEVar3->super_SyntaxNode).parent = (SyntaxNode *)this;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  __end2 = nonstd::span_lite::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>::begin
                     (&(this->items).
                       super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>);
  ppCVar4 = nonstd::span_lite::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>::end
                      (&(this->items).
                        super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>);
  for (; __end2 != ppCVar4; __end2 = __end2 + 1) {
    ((*__end2)->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

CaseGenerateSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, Token openParen, ExpressionSyntax& condition, Token closeParen, const SyntaxList<CaseItemSyntax>& items, Token endCase) :
        MemberSyntax(SyntaxKind::CaseGenerate, attributes), keyword(keyword), openParen(openParen), condition(&condition), closeParen(closeParen), items(items), endCase(endCase) {
        this->condition->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
    }